

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall
QFormLayoutPrivate::replaceAt(QFormLayoutPrivate *this,int index,QLayoutItem *newitem)

{
  long *plVar1;
  int iVar2;
  QFormLayoutItem **ppQVar3;
  QFormLayoutItem *item;
  QLayoutItem *pQVar4;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newitem == (QLayoutItem *)0x0) {
    pQVar4 = (QLayoutItem *)0x0;
  }
  else {
    if ((ulong)(long)index < (ulong)(this->m_things).d.size) {
      item = (this->m_things).d.ptr[index];
    }
    else {
      item = (QFormLayoutItem *)0x0;
    }
    plVar1 = *(long **)&(this->super_QLayoutPrivate).field_0x8;
    iVar2 = storageIndexFromLayoutItem(&this->m_matrix,item);
    if (iVar2 == -1) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_30 = "default";
      pQVar4 = (QLayoutItem *)0x0;
      QMessageLogger::warning(local_48,"QFormLayoutPrivate::replaceAt: Invalid index %d",index);
    }
    else {
      ppQVar3 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (&this->m_matrix,iVar2 / 2,iVar2 % 2);
      pQVar4 = (*ppQVar3)->item;
      (*ppQVar3)->item = newitem;
      (**(code **)(*plVar1 + 0x70))(plVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* QFormLayoutPrivate::replaceAt(int index, QLayoutItem *newitem)
{
    Q_Q(QFormLayout);
    if (!newitem)
        return nullptr;
    const int storageIndex = storageIndexFromLayoutItem(m_matrix, m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        // ### Qt6 - fix warning too when this class becomes public
        qWarning("QFormLayoutPrivate::replaceAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(m_matrix(row, col));

    QFormLayoutItem *item = m_matrix(row, col);
    Q_ASSERT(item);

    QLayoutItem *olditem = item->item;
    item->item = newitem;

    q->invalidate();
    return olditem;
}